

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ClearHorzJoins(Clipper *this)

{
  pointer ppHVar1;
  size_type i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppHVar1 = (this->m_HorizJoins).
                super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_HorizJoins).
                            super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar1 >> 3);
      uVar2 = uVar2 + 1) {
    operator_delete(ppHVar1[uVar2],0x10);
  }
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::resize
            (&this->m_HorizJoins,0);
  return;
}

Assistant:

void Clipper::ClearHorzJoins()
{
  for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); i++)
    delete m_HorizJoins[i];
  m_HorizJoins.resize(0);
}